

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pavgb_mips64el(uint64_t fs,uint64_t ft)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  
  uVar1 = pavgb((char)ft,(char)fs);
  uVar2 = pavgb((char)(ft >> 8),(char)(fs >> 8));
  uVar3 = pavgb((char)(ft >> 0x10),(char)(fs >> 0x10));
  uVar4 = pavgb((char)(ft >> 0x18),(char)(fs >> 0x18));
  uVar5 = pavgb((char)(ft >> 0x20),(char)(fs >> 0x20));
  uVar6 = pavgb((char)(ft >> 0x28),(char)(fs >> 0x28));
  uVar7 = pavgb((char)(ft >> 0x30),(char)(fs >> 0x30));
  uVar8 = pavgb((char)(ft >> 0x38),(char)(fs >> 0x38));
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  return CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(uVar4,CONCAT12(uVar3,
                                                  CONCAT11(uVar2,uVar1)))))));
}

Assistant:

uint64_t helper_pavgb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; i++) {
        vs.ub[i] = (vs.ub[i] + vt.ub[i] + 1) >> 1;
    }
    return vs.d;
}